

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O0

void __thiscall
gflags::anon_unknown_5::Test_DeprecatedFunctionsTest_ReadFromFlagsFile::
Test_DeprecatedFunctionsTest_ReadFromFlagsFile(Test_DeprecatedFunctionsTest_ReadFromFlagsFile *this)

{
  value_type local_18;
  Test_DeprecatedFunctionsTest_ReadFromFlagsFile *local_10;
  Test_DeprecatedFunctionsTest_ReadFromFlagsFile *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(DeprecatedFunctionsTest, ReadFromFlagsFile) {
  FLAGS_test_int32 = -10;    // just to make the test more interesting
  string filename(TmpFile("flagfile2"));
  unlink(filename.c_str());  // just to be safe
  bool r = AppendFlagsIntoFile(filename, GetArgv0());
  EXPECT_TRUE(r);

  FLAGS_test_int32 = -11;
  r = ReadFromFlagsFile(filename, GetArgv0(), true);
  EXPECT_TRUE(r);
  EXPECT_EQ(-10, FLAGS_test_int32);
}